

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStateType xVar1;
  xmlRegTrans *pxVar2;
  xmlRegStatePtr pxVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  xmlRegStatePtr *ppxVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  xmlRegStatePtr pxVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (ctxt->states == (xmlRegStatePtr *)0x0) {
    return;
  }
  uVar7 = (ulong)(uint)ctxt->nbStates;
  if (ctxt->nbStates < 1) {
LAB_00178fd6:
    ppxVar9 = ctxt->states;
LAB_00178fda:
    bVar5 = 0 < (int)uVar7;
    if (0 < (int)uVar7) {
      uVar15 = 0;
      do {
        if (ppxVar9[uVar15] != (xmlRegStatePtr)0x0) {
          ppxVar9[uVar15]->reached = XML_REGEXP_MARK_NORMAL;
        }
        uVar15 = uVar15 + 1;
      } while (uVar7 != uVar15);
      goto LAB_00179002;
    }
  }
  else {
    uVar15 = 0;
    do {
      pxVar13 = ctxt->states[uVar15];
      if ((((((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->nbTrans == 1)) &&
            (xVar1 = pxVar13->type, xVar1 != XML_REGEXP_FINAL_STATE)) &&
           ((xVar1 != XML_REGEXP_UNREACH_STATE &&
            (pxVar2 = pxVar13->trans, pxVar2->atom == (xmlRegAtomPtr)0x0)))) &&
          ((uVar14 = (ulong)(uint)pxVar2->to, uVar15 != uVar14 && -1 < pxVar2->to &&
           ((pxVar2->counter < 0 && (xVar1 != XML_REGEXP_START_STATE)))))) && (pxVar2->count < 0)) {
        iVar8 = pxVar13->nbTransTo;
        if (0 < iVar8) {
          lVar12 = 0;
          do {
            pxVar3 = ctxt->states[pxVar13->transTo[lVar12]];
            iVar6 = pxVar3->nbTrans;
            if (0 < iVar6) {
              lVar11 = 0x10;
              lVar10 = 0;
              do {
                pxVar2 = pxVar3->trans;
                if (uVar15 == *(uint *)((long)pxVar2 + lVar11 + -8)) {
                  *(undefined4 *)((long)pxVar2 + lVar11 + -8) = 0xffffffff;
                  xmlRegStateAddTrans(ctxt,pxVar3,*(xmlRegAtomPtr *)((long)pxVar2 + lVar11 + -0x10),
                                      ctxt->states[uVar14],*(int *)((long)pxVar2 + lVar11 + -4),
                                      *(int *)((long)&pxVar2->atom + lVar11));
                  iVar6 = pxVar3->nbTrans;
                }
                lVar10 = lVar10 + 1;
                lVar11 = lVar11 + 0x18;
              } while (lVar10 < iVar6);
              iVar8 = pxVar13->nbTransTo;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar8);
          if (pxVar13->type == XML_REGEXP_FINAL_STATE) {
            ctxt->states[uVar14]->type = XML_REGEXP_FINAL_STATE;
          }
        }
        pxVar13->nbTrans = 0;
        pxVar13->type = XML_REGEXP_UNREACH_STATE;
        uVar7 = (ulong)(uint)ctxt->nbStates;
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)(int)uVar7);
    if ((int)uVar7 < 1) goto LAB_00178fd6;
    lVar12 = 0;
    do {
      pxVar13 = ctxt->states[lVar12];
      if ((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->type == XML_REGEXP_UNREACH_STATE)) {
        if (pxVar13->trans != (xmlRegTrans *)0x0) {
          (*xmlFree)(pxVar13->trans);
        }
        if (pxVar13->transTo != (int *)0x0) {
          (*xmlFree)(pxVar13->transTo);
        }
        (*xmlFree)(pxVar13);
        ctxt->states[lVar12] = (xmlRegStatePtr)0x0;
        uVar7 = (ulong)(uint)ctxt->nbStates;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar7);
    if ((int)uVar7 < 1) goto LAB_00178fd6;
    bVar5 = false;
    do {
      uVar15 = uVar7 - 1;
      pxVar13 = ctxt->states[uVar7 - 1];
      if (pxVar13 != (xmlRegStatePtr)0x0) {
        iVar8 = pxVar13->nbTrans;
        if (iVar8 == 0) {
          if (pxVar13->type != XML_REGEXP_FINAL_STATE) {
            pxVar13->type = XML_REGEXP_SINK_STATE;
          }
        }
        else if (0 < iVar8) {
          lVar10 = 0x10;
          lVar12 = 0;
          do {
            pxVar2 = pxVar13->trans;
            if (*(long *)((long)pxVar2 + lVar10 + -0x10) == 0) {
              iVar6 = *(int *)((long)pxVar2 + lVar10 + -8);
              if (-1 < (long)iVar6) {
                if (uVar15 == (long)iVar6) {
                  *(undefined4 *)((long)pxVar2 + lVar10 + -8) = 0xffffffff;
                }
                else if (*(int *)((long)&pxVar2->atom + lVar10) < 0) {
                  *(undefined4 *)((long)pxVar2 + lVar10 + -8) = 0xfffffffe;
                  pxVar13->mark = XML_REGEXP_MARK_START;
                  xmlFAReduceEpsilonTransitions
                            (ctxt,(int)uVar15,iVar6,*(int *)((long)pxVar2 + lVar10 + -4));
                  xmlFAFinishReduceEpsilonTransitions(ctxt,iVar6);
                  pxVar13->mark = XML_REGEXP_MARK_NORMAL;
                  iVar8 = pxVar13->nbTrans;
                  bVar5 = true;
                }
              }
            }
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + 0x18;
          } while (lVar12 < iVar8);
        }
      }
      bVar4 = 1 < (long)uVar7;
      uVar7 = uVar15;
    } while (bVar4);
    uVar7 = (ulong)(uint)ctxt->nbStates;
    if (!bVar5) goto LAB_00178fd6;
    ppxVar9 = ctxt->states;
    if (0 < ctxt->nbStates) {
      uVar15 = 0;
      do {
        pxVar13 = ppxVar9[uVar15];
        if ((pxVar13 != (xmlRegStatePtr)0x0) && (iVar8 = pxVar13->nbTrans, 0 < (long)iVar8)) {
          pxVar2 = pxVar13->trans;
          lVar12 = 0;
          do {
            if (((*(long *)((long)&pxVar2->atom + lVar12) == 0) &&
                (*(int *)((long)&pxVar2->count + lVar12) < 0)) &&
               (-1 < *(int *)((long)&pxVar2->to + lVar12))) {
              *(undefined4 *)((long)&pxVar2->to + lVar12) = 0xffffffff;
            }
            lVar12 = lVar12 + 0x18;
          } while ((long)iVar8 * 0x18 != lVar12);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar7);
      goto LAB_00178fda;
    }
  }
  bVar5 = false;
LAB_00179002:
  pxVar13 = *ppxVar9;
  if (pxVar13 != (xmlRegStatePtr)0x0) {
    pxVar13->reached = XML_REGEXP_MARK_START;
    do {
      pxVar13->reached = XML_REGEXP_MARK_VISITED;
      iVar8 = pxVar13->nbTrans;
      if ((long)iVar8 < 1) {
        pxVar13 = (xmlRegStatePtr)0x0;
      }
      else {
        pxVar2 = pxVar13->trans;
        lVar12 = 0;
        pxVar13 = (xmlRegStatePtr)0x0;
        do {
          lVar10 = (long)*(int *)((long)&pxVar2->to + lVar12);
          if (((-1 < lVar10) &&
              ((*(long *)((long)&pxVar2->atom + lVar12) != 0 ||
               (-1 < *(int *)((long)&pxVar2->count + lVar12))))) &&
             ((pxVar3 = ppxVar9[lVar10], pxVar3 != (xmlRegStatePtr)0x0 &&
              (pxVar3->reached == XML_REGEXP_MARK_NORMAL)))) {
            pxVar3->reached = XML_REGEXP_MARK_START;
            pxVar13 = pxVar3;
          }
          lVar12 = lVar12 + 0x18;
        } while ((long)iVar8 * 0x18 != lVar12);
      }
      if ((pxVar13 == (xmlRegStatePtr)0x0) && (1 < (int)uVar7)) {
        uVar15 = 1;
        while ((pxVar13 = ppxVar9[uVar15], pxVar13 == (xmlRegStatePtr)0x0 ||
               (pxVar13->reached != XML_REGEXP_MARK_START))) {
          uVar15 = uVar15 + 1;
          if (uVar7 == uVar15) goto LAB_001790ab;
        }
      }
    } while (pxVar13 != (xmlRegStatePtr)0x0);
  }
LAB_001790ab:
  if (bVar5) {
    lVar12 = 0;
    do {
      pxVar13 = ctxt->states[lVar12];
      if ((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->reached == XML_REGEXP_MARK_NORMAL)) {
        if (pxVar13->trans != (xmlRegTrans *)0x0) {
          (*xmlFree)(pxVar13->trans);
        }
        if (pxVar13->transTo != (int *)0x0) {
          (*xmlFree)(pxVar13->transTo);
        }
        (*xmlFree)(pxVar13);
        ctxt->states[lVar12] = (xmlRegStatePtr)0x0;
        uVar7 = (ulong)(uint)ctxt->nbStates;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar7);
  }
  return;
}

Assistant:

static void
xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    int has_epsilon;

    if (ctxt->states == NULL) return;

    /*
     * Eliminate simple epsilon transition and the associated unreachable
     * states.
     */
    xmlFAEliminateSimpleEpsilonTransitions(ctxt);
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->type == XML_REGEXP_UNREACH_STATE)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

    has_epsilon = 0;

    /*
     * Build the completed transitions bypassing the epsilons
     * Use a marking algorithm to avoid loops
     * Mark sink states too.
     * Process from the latest states backward to the start when
     * there is long cascading epsilon chains this minimize the
     * recursions and transition compares when adding the new ones
     */
    for (statenr = ctxt->nbStates - 1;statenr >= 0;statenr--) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if ((state->nbTrans == 0) &&
	    (state->type != XML_REGEXP_FINAL_STATE)) {
	    state->type = XML_REGEXP_SINK_STATE;
	}
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].atom == NULL) &&
		(state->trans[transnr].to >= 0)) {
		if (state->trans[transnr].to == statenr) {
		    state->trans[transnr].to = -1;
		} else if (state->trans[transnr].count < 0) {
		    int newto = state->trans[transnr].to;

		    has_epsilon = 1;
		    state->trans[transnr].to = -2;
		    state->mark = XML_REGEXP_MARK_START;
		    xmlFAReduceEpsilonTransitions(ctxt, statenr,
				      newto, state->trans[transnr].counter);
		    xmlFAFinishReduceEpsilonTransitions(ctxt, newto);
		    state->mark = XML_REGEXP_MARK_NORMAL;
	        }
	    }
	}
    }
    /*
     * Eliminate the epsilon transitions
     */
    if (has_epsilon) {
	for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	    state = ctxt->states[statenr];
	    if (state == NULL)
		continue;
	    for (transnr = 0;transnr < state->nbTrans;transnr++) {
		xmlRegTransPtr trans = &(state->trans[transnr]);
		if ((trans->atom == NULL) &&
		    (trans->count < 0) &&
		    (trans->to >= 0)) {
		    trans->to = -1;
		}
	    }
	}
    }

    /*
     * Use this pass to detect unreachable states too
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state != NULL)
	    state->reached = XML_REGEXP_MARK_NORMAL;
    }
    state = ctxt->states[0];
    if (state != NULL)
	state->reached = XML_REGEXP_MARK_START;
    while (state != NULL) {
	xmlRegStatePtr target = NULL;
	state->reached = XML_REGEXP_MARK_VISITED;
	/*
	 * Mark all states reachable from the current reachable state
	 */
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].to >= 0) &&
		((state->trans[transnr].atom != NULL) ||
		 (state->trans[transnr].count >= 0))) {
		int newto = state->trans[transnr].to;

		if (ctxt->states[newto] == NULL)
		    continue;
		if (ctxt->states[newto]->reached == XML_REGEXP_MARK_NORMAL) {
		    ctxt->states[newto]->reached = XML_REGEXP_MARK_START;
		    target = ctxt->states[newto];
		}
	    }
	}

	/*
	 * find the next accessible state not explored
	 */
	if (target == NULL) {
	    for (statenr = 1;statenr < ctxt->nbStates;statenr++) {
		state = ctxt->states[statenr];
		if ((state != NULL) && (state->reached ==
			XML_REGEXP_MARK_START)) {
		    target = state;
		    break;
		}
	    }
	}
	state = target;
    }
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->reached == XML_REGEXP_MARK_NORMAL)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

}